

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O3

void __thiscall
SolverTest_OptionHeader_Test::TestBody()::OptionTestSolver::~OptionTestSolver
          (OptionTestSolver *this)

{
  void *pvVar1;
  
  *(undefined ***)(this + -0x80) = &PTR__Solver_00287fd8;
  *(undefined ***)(this + -0x78) = &PTR__Solver_00288048;
  *(undefined ***)(this + -0x60) = &PTR__Solver_00288070;
  *(undefined ***)(this + -0x58) = &PTR__Solver_002880a0;
  *(undefined ***)this = &PTR__Solver_002880c0;
  pvVar1 = *(void **)(this + 0x268);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)(this + 0x278) - (long)pvVar1);
  }
  mp::BasicSolver::~BasicSolver((BasicSolver *)(this + -0x80));
  operator_delete((BasicSolver *)(this + -0x80),0x300);
  return;
}

Assistant:

TEST(SolverTest, OptionHeader) {
  struct OptionTestSolver : Solver {
    OptionTestSolver() : Solver("testsolver", 0, 0, 0) {}
    void set_option_header() {
      Solver::set_option_header("test header");
    }
    int DoSolve(Problem &, SolutionHandler &) { return 0; }
    void ReadNL(fmt::StringRef) {}
  } s;
  EXPECT_STREQ("", s.option_header());
  s.set_option_header();
  EXPECT_STREQ("test header", s.option_header());
}